

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_new_string8(JSContext *ctx,uint8_t *buf,int len)

{
  JSValueUnion JVar1;
  int in_EDX;
  void *in_RSI;
  JSContext *in_RDI;
  JSString *str;
  JSAtom in_stack_ffffffffffffffcc;
  JSContext *in_stack_ffffffffffffffd0;
  JSValueUnion local_10;
  int64_t local_8;
  
  if (in_EDX < 1) {
    _local_10 = JS_AtomToString(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  else {
    JVar1.ptr = js_alloc_string(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    if ((JSString *)JVar1.ptr == (JSString *)0x0) {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 6;
    }
    else {
      memcpy((JSString *)((long)JVar1.ptr + 0x10),in_RSI,(long)in_EDX);
      *(undefined1 *)((long)JVar1.ptr + (long)in_EDX + 0x10) = 0;
      local_8 = -7;
      local_10.ptr = JVar1.ptr;
    }
  }
  return _local_10;
}

Assistant:

static JSValue js_new_string8(JSContext *ctx, const uint8_t *buf, int len)
{
    JSString *str;

    if (len <= 0) {
        return JS_AtomToString(ctx, JS_ATOM_empty_string);
    }
    str = js_alloc_string(ctx, len, 0);
    if (!str)
        return JS_EXCEPTION;
    memcpy(str->u.str8, buf, len);
    str->u.str8[len] = '\0';
    return JS_MKPTR(JS_TAG_STRING, str);
}